

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.cpp
# Opt level: O2

void __thiscall ast_compound_statement::print(ast_compound_statement *this)

{
  exec_node **ppeVar1;
  exec_node *peVar2;
  
  puts("{");
  peVar2 = &(this->statements).head_sentinel;
  while ((peVar2 = ((exec_node *)&peVar2->next)->next, peVar2->next != (exec_node *)0x0 &&
         (ppeVar1 = &peVar2[-3].prev, ppeVar1 != (exec_node **)0x0))) {
    (*(code *)(*ppeVar1)->next)(ppeVar1);
  }
  puts("}");
  return;
}

Assistant:

void
ast_compound_statement::print(void) const
{
   printf("{\n");

   foreach_list_typed(ast_node, ast, link, &this->statements) {
      ast->print();
   }

   printf("}\n");
}